

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::setEigenDecomposition
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  uint length;
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  int len;
  
  beagleMemCpy<float,double_const>
            (*(float **)(*(long *)(in_RDI + 8) + (long)in_ESI * 8),in_R8,*(uint *)(in_RDI + 0x54));
  length = *(int *)(in_RDI + 0x10) * *(int *)(in_RDI + 0x10);
  beagleMemCpy<float,double_const>
            (*(float **)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8),in_RDX,length);
  beagleMemCpy<float,double_const>
            (*(float **)(*(long *)(in_RDI + 0x48) + (long)in_ESI * 8),in_RCX,length);
  if ((*(ulong *)(in_RDI + 0x20) & 0x200000) != 0) {
    transposeSquareMatrix<float>
              (*(float **)(*(long *)(in_RDI + 0x48) + (long)in_ESI * 8),*(int *)(in_RDI + 0x10));
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}